

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

int test_node_traverse(void)

{
  undefined8 uVar1;
  int local_a4;
  uint local_a0;
  int word_length;
  int i;
  int length;
  string_s head;
  words_s *words;
  uint32_t expected_letters;
  uint32_t node_id;
  uint8_t word [5];
  trie_s *trie;
  int res;
  
  uVar1 = yatrie_new(500,500,200);
  yatrie_add(anon_var_dwarf_905,0,uVar1);
  yatrie_add(anon_var_dwarf_911,0,uVar1);
  yatrie_add(anon_var_dwarf_91d,0,uVar1);
  yatrie_add(anon_var_dwarf_929,0,uVar1);
  yatrie_add(anon_var_dwarf_935,0,uVar1);
  head.letters._92_8_ = calloc(1,0x2714);
  memset(&i,0,0x68);
  yatrie_node_traverse(head.letters._92_8_,0,&i,uVar1);
  word_length = 0;
  for (local_a0 = 0; local_a0 < *(uint *)head.letters._92_8_; local_a0 = local_a0 + 1) {
    for (local_a4 = 0;
        *(char *)(head.letters._92_8_ + 4 + (long)(int)local_a0 * 100 + (long)local_a4) != '\0';
        local_a4 = local_a4 + 1) {
      word_length = word_length + 1;
    }
  }
  if (word_length != 0x1d) {
    printf("assert failed: %s:%i expression: %s\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/legale[P]libtrie/tests/tests.c"
           ,0x2f5,"length == expected_letters");
  }
  trie._4_4_ = (uint)(word_length != 0x1d);
  yatrie_free(uVar1);
  free((void *)head.letters._92_8_);
  return trie._4_4_;
}

Assistant:

static int test_node_traverse() {
    int res = 0;

    trie_s *trie = yatrie_new(500, 500, 200);



    uint8_t word[] = "ёж";
    uint32_t node_id;

    yatrie_add("ёжистый", 0, trie); //7 letter
    yatrie_add("ёж", 0, trie); //2 letters
    yatrie_add("ёжисты", 0, trie); //6 letters
    yatrie_add("ёжистая", 0, trie); //7 letters
    yatrie_add("ёжистее", 0, trie); //7 letters


    //create words letters number array
    uint32_t expected_letters = 2 + 6 + 7 + 7 + 7;

    //create words container
    words_s *words = (words_s *)calloc(1, sizeof(words_s));

    //head container
    string_s head = {};

    yatrie_node_traverse(words, 0, &head, trie);

    //words letters counter
    int length = 0;
    for (int i = 0; i < words->counter; ++i) {
        int word_length = 0;
        while (words->words[i][word_length]) {
            length++;
            word_length++;
        }
    }
    U_ASSERT(res, length == expected_letters);


    yatrie_free(trie);
    free(words);
    return res;
}